

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManIsoStrashReduce(Gia_Man_t *p,Vec_Ptr_t **pvPosEquivs,int fVerbose)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  uint uVar3;
  Vec_Wec_t *vSupps;
  Vec_Wec_t *__ptr;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Gia_Man_t *pGVar6;
  Vec_Ptr_t *pVVar7;
  void **ppvVar8;
  void *pvVar9;
  int fVerbose_00;
  long lVar10;
  ulong uVar11;
  int iVar12;
  size_t __size;
  
  vSupps = Gia_ManCreateCoSupps(p,fVerbose);
  __ptr = Gia_ManIsoStrashReduceInt(p,vSupps,fVerbose_00);
  uVar1 = __ptr->nSize;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  uVar3 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar3 = uVar1;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = uVar3;
  iVar12 = 0;
  if (uVar3 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)(int)uVar3 << 2);
  }
  pVVar4->pArray = piVar5;
  if (0 < (int)uVar1) {
    pVVar2 = __ptr->pArray;
    lVar10 = 0;
    do {
      if (0 < *(int *)((long)&pVVar2->nSize + lVar10)) {
        Vec_IntPush(pVVar4,**(int **)((long)&pVVar2->pArray + lVar10));
      }
      lVar10 = lVar10 + 0x10;
    } while ((ulong)uVar1 << 4 != lVar10);
    piVar5 = pVVar4->pArray;
    iVar12 = pVVar4->nSize;
  }
  pGVar6 = Gia_ManDupCones(p,piVar5,iVar12,0);
  if (piVar5 != (int *)0x0) {
    free(piVar5);
  }
  free(pVVar4);
  iVar12 = vSupps->nCap;
  pVVar4 = vSupps->pArray;
  if ((long)iVar12 < 1) {
    if (pVVar4 != (Vec_Int_t *)0x0) goto LAB_0068a58b;
  }
  else {
    lVar10 = 0;
    do {
      pvVar9 = *(void **)((long)&pVVar4->pArray + lVar10);
      if (pvVar9 != (void *)0x0) {
        free(pvVar9);
        *(undefined8 *)((long)&pVVar4->pArray + lVar10) = 0;
      }
      lVar10 = lVar10 + 0x10;
    } while ((long)iVar12 * 0x10 != lVar10);
LAB_0068a58b:
    free(pVVar4);
  }
  free(vSupps);
  if (fVerbose != 0) {
    puts("Nontrivial classes:");
    iVar12 = __ptr->nSize;
    if (0 < (long)iVar12) {
      pVVar4 = __ptr->pArray;
      uVar11 = 0;
      do {
        if (pVVar4[uVar11].nSize != 1) {
          printf(" %4d : {",uVar11 & 0xffffffff);
          if (0 < pVVar4[uVar11].nSize) {
            lVar10 = 0;
            do {
              printf(" %d",(ulong)(uint)pVVar4[uVar11].pArray[lVar10]);
              lVar10 = lVar10 + 1;
            } while (lVar10 < pVVar4[uVar11].nSize);
          }
          puts(" }");
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != (long)iVar12);
    }
  }
  if (pvPosEquivs != (Vec_Ptr_t **)0x0) {
    uVar1 = __ptr->nSize;
    pVVar7 = (Vec_Ptr_t *)malloc(0x10);
    uVar3 = 8;
    if (6 < uVar1 - 1) {
      uVar3 = uVar1;
    }
    pVVar7->nSize = 0;
    pVVar7->nCap = uVar3;
    if (uVar3 == 0) {
      ppvVar8 = (void **)0x0;
    }
    else {
      ppvVar8 = (void **)malloc((long)(int)uVar3 << 3);
    }
    pVVar7->pArray = ppvVar8;
    if (0 < (int)uVar1) {
      lVar10 = 8;
      uVar11 = 0;
      do {
        pVVar4 = __ptr->pArray;
        piVar5 = (int *)malloc(0x10);
        iVar12 = *(int *)((long)pVVar4 + lVar10 + -4);
        piVar5[1] = iVar12;
        *piVar5 = iVar12;
        if ((long)iVar12 == 0) {
          __size = 0;
          pvVar9 = (void *)0x0;
        }
        else {
          __size = (long)iVar12 << 2;
          pvVar9 = malloc(__size);
        }
        *(void **)(piVar5 + 2) = pvVar9;
        memcpy(pvVar9,*(void **)((long)&pVVar4->nCap + lVar10),__size);
        if ((uint)uVar11 == uVar3) {
          ppvVar8 = pVVar7->pArray;
          if (uVar11 < 0x10) {
            if (ppvVar8 == (void **)0x0) {
              ppvVar8 = (void **)malloc(0x80);
            }
            else {
              ppvVar8 = (void **)realloc(ppvVar8,0x80);
            }
            pVVar7->pArray = ppvVar8;
            uVar3 = 0x10;
          }
          else {
            if (ppvVar8 == (void **)0x0) {
              ppvVar8 = (void **)malloc(lVar10 - 8U);
            }
            else {
              ppvVar8 = (void **)realloc(ppvVar8,lVar10 - 8U);
            }
            pVVar7->pArray = ppvVar8;
            uVar3 = uVar3 * 2;
          }
        }
        else {
          ppvVar8 = pVVar7->pArray;
        }
        ppvVar8[uVar11] = piVar5;
        uVar11 = uVar11 + 1;
        lVar10 = lVar10 + 0x10;
      } while (uVar1 != uVar11);
      pVVar7->nSize = uVar1;
      pVVar7->nCap = uVar3;
    }
    *pvPosEquivs = pVVar7;
  }
  iVar12 = __ptr->nCap;
  pVVar4 = __ptr->pArray;
  if ((long)iVar12 < 1) {
    if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_0068a7b7;
  }
  else {
    lVar10 = 0;
    do {
      pvVar9 = *(void **)((long)&pVVar4->pArray + lVar10);
      if (pvVar9 != (void *)0x0) {
        free(pvVar9);
        *(undefined8 *)((long)&pVVar4->pArray + lVar10) = 0;
      }
      lVar10 = lVar10 + 0x10;
    } while ((long)iVar12 * 0x10 != lVar10);
  }
  free(pVVar4);
LAB_0068a7b7:
  free(__ptr);
  return pGVar6;
}

Assistant:

Gia_Man_t * Gia_ManIsoStrashReduce( Gia_Man_t * p, Vec_Ptr_t ** pvPosEquivs, int fVerbose )
{
    Vec_Wec_t * vSupps = Gia_ManCreateCoSupps( p, fVerbose );
    Vec_Wec_t * vPosEquivs = Gia_ManIsoStrashReduceInt( p, vSupps, fVerbose );
    // find the first outputs and derive GIA
    Vec_Int_t * vFirsts = Vec_WecCollectFirsts( vPosEquivs );
    Gia_Man_t * pNew = Gia_ManDupCones( p, Vec_IntArray(vFirsts), Vec_IntSize(vFirsts), 0 );
    Vec_IntFree( vFirsts );
    Vec_WecFree( vSupps );
    // report and return    
    if ( fVerbose )
    { 
        printf( "Nontrivial classes:\n" );
        Vec_WecPrint( vPosEquivs, 1 );
    }
    if ( pvPosEquivs )
        *pvPosEquivs = Vec_WecConvertToVecPtr( vPosEquivs );
    Vec_WecFree( vPosEquivs );
    return pNew;
}